

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

void arg_dump_r(cmd_ln_t *cmdln,FILE *fp,arg_t *defn,int32 doc)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  size_t sVar4;
  void *__base;
  anytype_t *paVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  size_t sVar11;
  arg_t *paVar12;
  ulong uVar13;
  size_t n_elem;
  long *plVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  long lVar19;
  
  if (fp == (FILE *)0x0) {
    return;
  }
  pcVar9 = defn->name;
  if (pcVar9 == (char *)0x0) {
    fwrite("[NAME]",6,1,(FILE *)fp);
    fwrite("\t[DEFLT]",8,1,(FILE *)fp);
    uVar16 = 0;
    uVar8 = 0;
    iVar10 = 0;
  }
  else {
    paVar12 = defn + 1;
    iVar10 = 0;
    uVar15 = 0;
    uVar7 = 0;
    do {
      sVar4 = strlen(pcVar9);
      uVar3 = (uint)sVar4;
      if ((int)(uint)sVar4 < (int)uVar15) {
        uVar3 = uVar15;
      }
      uVar15 = uVar3;
      if (paVar12[-1].deflt == (char *)0x0) {
        uVar3 = 6;
      }
      else {
        sVar4 = strlen(paVar12[-1].deflt);
        uVar3 = (uint)sVar4;
      }
      if ((int)uVar7 <= (int)uVar3) {
        uVar7 = uVar3;
      }
      pcVar9 = paVar12->name;
      iVar10 = iVar10 + 1;
      paVar12 = paVar12 + 1;
    } while (pcVar9 != (char *)0x0);
    uVar16 = (ulong)(uVar15 & 0xfffffff8);
    uVar8 = (ulong)(uVar7 & 0xfffffff8);
    uVar13 = 6;
    fwrite("[NAME]",6,1,(FILE *)fp);
    if ((uVar15 & 0xfffffff8) != 0) {
      do {
        fputc(9,(FILE *)fp);
        uVar13 = uVar13 + 8;
      } while (uVar13 < uVar16);
    }
    fwrite("\t[DEFLT]",8,1,(FILE *)fp);
    if (uVar8 != 0) {
      uVar13 = 7;
      do {
        fputc(9,(FILE *)fp);
        uVar13 = uVar13 + 8;
      } while (uVar13 < uVar8);
    }
  }
  pcVar9 = "\t[DESCR]\n";
  if (doc == 0) {
    pcVar9 = "\t[VALUE]\n";
  }
  fwrite(pcVar9,9,1,(FILE *)fp);
  n_elem = (size_t)iVar10;
  __base = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x95);
  auVar2 = _DAT_00136da0;
  if (iVar10 < 1) {
    qsort(__base,n_elem,8,cmp_name);
  }
  else {
    lVar6 = n_elem - 1;
    auVar17._8_4_ = (int)lVar6;
    auVar17._0_8_ = lVar6;
    auVar17._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar17 = auVar17 ^ _DAT_00136da0;
    auVar18 = _DAT_00136d90;
    do {
      auVar20 = auVar18 ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                  auVar17._4_4_ < auVar20._4_4_) & 1)) {
        *(arg_t **)((long)__base + lVar6) = defn;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        *(arg_t **)((long)__base + lVar6 + 8) = defn + 1;
      }
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar19 + 2;
      lVar6 = lVar6 + 0x10;
      defn = defn + 2;
    } while ((ulong)(iVar10 + 1U >> 1) << 4 != lVar6);
    qsort(__base,n_elem,8,cmp_name);
    if (0 < iVar10) {
      sVar11 = 0;
      do {
        fputs((char *)**(undefined8 **)((long)__base + sVar11 * 8),(FILE *)fp);
        for (uVar13 = strlen((char *)**(undefined8 **)((long)__base + sVar11 * 8)); uVar13 < uVar16;
            uVar13 = uVar13 + 8) {
          fputc(9,(FILE *)fp);
        }
        fputc(9,(FILE *)fp);
        pcVar9 = *(char **)(*(long *)((long)__base + sVar11 * 8) + 0x10);
        if (pcVar9 == (char *)0x0) {
          sVar4 = 0;
        }
        else {
          fputs(pcVar9,(FILE *)fp);
          sVar4 = strlen(*(char **)(*(long *)((long)__base + sVar11 * 8) + 0x10));
        }
        for (; sVar4 < uVar8; sVar4 = sVar4 + 8) {
          fputc(9,(FILE *)fp);
        }
        fputc(9,(FILE *)fp);
        puVar1 = *(undefined8 **)((long)__base + sVar11 * 8);
        if (doc == 0) {
          paVar5 = cmd_ln_access_r(cmdln,(char *)*puVar1);
          if (paVar5 != (anytype_t *)0x0) {
            iVar10 = *(int *)(*(long *)((long)__base + sVar11 * 8) + 8);
            switch(iVar10) {
            case 2:
            case 3:
              fprintf((FILE *)fp,"%ld",paVar5->ptr);
              break;
            case 4:
            case 5:
              fprintf((FILE *)fp,"%e",paVar5->ptr);
              break;
            case 6:
            case 7:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
switchD_00117420_caseD_6:
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                      ,0x146,"Unknown argument type: %d\n");
              break;
            case 8:
            case 9:
              pcVar9 = (char *)paVar5->ptr;
              goto LAB_001173d4;
            case 0x10:
            case 0x11:
              pcVar9 = "yes";
              if (paVar5->ptr == (void *)0x0) {
                pcVar9 = "no";
              }
              goto LAB_001173dd;
            default:
              if (iVar10 != 0x20) goto switchD_00117420_caseD_6;
              plVar14 = (long *)paVar5->ptr;
              if (plVar14 != (long *)0x0) {
                lVar6 = *plVar14;
                while (lVar6 != 0) {
                  plVar14 = plVar14 + 1;
                  fprintf((FILE *)fp,"%s,");
                  lVar6 = *plVar14;
                }
              }
            }
          }
        }
        else {
          pcVar9 = (char *)puVar1[3];
LAB_001173d4:
          if (pcVar9 != (char *)0x0) {
LAB_001173dd:
            fputs(pcVar9,(FILE *)fp);
          }
        }
        fputc(10,(FILE *)fp);
        sVar11 = sVar11 + 1;
      } while (sVar11 != n_elem);
    }
  }
  ckd_free(__base);
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

static void
arg_dump_r(cmd_ln_t *cmdln, FILE *fp, const arg_t * defn, int32 doc)
{
    arg_t const **pos;
    int32 i, n;
    size_t l;
    int32 namelen, deflen;
    anytype_t *vp;
    char const **array;

    /* No definitions, do nothing. */
    if (defn == NULL || fp == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    /*    E_INFO("String length %d. Name length %d, Default Length %d\n",n, namelen, deflen); */
    namelen = namelen & 0xfffffff8;     /* Previous tab position */
    deflen = deflen & 0xfffffff8;       /* Previous tab position */

    fprintf(fp, "[NAME]");
    for (l = strlen("[NAME]"); l < namelen; l += 8)
        fprintf(fp, "\t");
    fprintf(fp, "\t[DEFLT]");
    for (l = strlen("[DEFLT]"); l < deflen; l += 8)
        fprintf(fp, "\t");

    if (doc) {
        fprintf(fp, "\t[DESCR]\n");
    }
    else {
        fprintf(fp, "\t[VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        fprintf(fp, "%s", pos[i]->name);
        for (l = strlen(pos[i]->name); l < namelen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (pos[i]->deflt) {
            fprintf(fp, "%s", pos[i]->deflt);
            l = strlen(pos[i]->deflt);
        }
        else
            l = 0;
        for (; l < deflen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (doc) {
            if (pos[i]->doc)
                fprintf(fp, "%s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    fprintf(fp, "%ld", vp->i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    fprintf(fp, "%e", vp->fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->ptr)
                        fprintf(fp, "%s", (char *)vp->ptr);
                    break;
                case ARG_STRING_LIST:
                    array = (char const**)vp->ptr;
                    if (array)
                        for (l = 0; array[l] != 0; l++) {
                            fprintf(fp, "%s,", array[l]);
                        }
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    fprintf(fp, "%s", vp->i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        fprintf(fp, "\n");
    }
    ckd_free(pos);

    fprintf(fp, "\n");
}